

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

Result __thiscall
testing::internal::FunctionMocker<bool_(const_pstore::brokerface::message_type_&)>::Invoke
          (FunctionMocker<bool_(const_pstore::brokerface::message_type_&)> *this,message_type *args)

{
  bool bVar1;
  UntypedActionResultHolderBase *f;
  ActionResultHolder<bool> *pAVar2;
  ArgumentTuple tuple;
  message_type *local_10;
  
  local_10 = args;
  f = UntypedFunctionMockerBase::UntypedInvokeWith(&this->super_UntypedFunctionMockerBase,&local_10)
  ;
  pAVar2 = DownCast_<testing::internal::ActionResultHolder<bool>*,testing::internal::UntypedActionResultHolderBase>
                     (f);
  bVar1 = (pAVar2->result_).value_;
  (*(pAVar2->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase[1])(pAVar2);
  return bVar1;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    ArgumentTuple tuple(std::forward<Args>(args)...);
    std::unique_ptr<ResultHolder> holder(DownCast_<ResultHolder*>(
        this->UntypedInvokeWith(static_cast<void*>(&tuple))));
    return holder->Unwrap();
  }